

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O0

Aig_Obj_t ** Ssw_ObjRemoveClass(Ssw_Cla_t *p,Aig_Obj_t *pRepr)

{
  int iVar1;
  Aig_Obj_t **ppAVar2;
  int nSize;
  Aig_Obj_t **pClass;
  Aig_Obj_t *pRepr_local;
  Ssw_Cla_t *p_local;
  
  ppAVar2 = p->pId2Class[pRepr->Id];
  if (ppAVar2 == (Aig_Obj_t **)0x0) {
    __assert_fail("pClass != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                  ,0x77,"Aig_Obj_t **Ssw_ObjRemoveClass(Ssw_Cla_t *, Aig_Obj_t *)");
  }
  p->pId2Class[pRepr->Id] = (Aig_Obj_t **)0x0;
  iVar1 = p->pClassSizes[pRepr->Id];
  if (1 < iVar1) {
    p->nClasses = p->nClasses + -1;
    p->nLits = p->nLits - (iVar1 + -1);
    p->pClassSizes[pRepr->Id] = 0;
    return ppAVar2;
  }
  __assert_fail("nSize > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                ,0x7a,"Aig_Obj_t **Ssw_ObjRemoveClass(Ssw_Cla_t *, Aig_Obj_t *)");
}

Assistant:

static inline Aig_Obj_t ** Ssw_ObjRemoveClass( Ssw_Cla_t * p, Aig_Obj_t * pRepr )
{
    Aig_Obj_t ** pClass = p->pId2Class[pRepr->Id];
    int nSize;
    assert( pClass != NULL );
    p->pId2Class[pRepr->Id] = NULL;
    nSize = p->pClassSizes[pRepr->Id];
    assert( nSize > 1 );
    p->nClasses--;
    p->nLits -= nSize - 1;
    p->pClassSizes[pRepr->Id] = 0;
    return pClass;
}